

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSphere.cpp
# Opt level: O1

void __thiscall
dgSphere::SetDimensions
          (dgSphere *this,HaF32 *vertex,HaI32 strideInBytes,HaI32 *triangles,HaI32 indexCount,
          dgMatrix *basis)

{
  dgTemplateVector<float> dVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  float *pfVar8;
  ulong uVar9;
  int stride;
  int i;
  long lVar10;
  uint uVar11;
  HaF32 HVar12;
  int iVar13;
  int i_00;
  int iVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  HaF32 *ptr;
  dgVector scaleVector;
  dgVector eigen;
  dgTemplateVector<float> local_50;
  dgTemplateVector<float> local_40;
  
  local_50.m_x = 1.0;
  local_50.m_y = 1.0;
  local_50.m_z = 1.0;
  local_50.m_w = 0.0;
  if (indexCount < 3) {
    return;
  }
  stride = strideInBytes >> 2;
  if (basis == (dgMatrix *)0x0) {
    InternalSphere::Statistics
              (this,(dgVector *)&local_40,(dgVector *)&local_50,vertex,triangles,indexCount,stride);
    iVar13 = 0;
    i_00 = 0;
    do {
      iVar14 = 2;
      if (2 < i_00) {
        iVar14 = i_00;
      }
      i = i_00;
      do {
        i = i + 1;
        if (i - iVar14 == 1) goto LAB_008767c3;
        pfVar8 = dgTemplateVector<float>::operator[](&local_40,i_00);
        fVar25 = *pfVar8;
        pfVar8 = dgTemplateVector<float>::operator[](&local_40,i);
        fVar16 = *pfVar8;
        auVar22._0_8_ = (ulong)(uint)fVar25 ^ 0x8000000080000000;
        auVar22._8_4_ = 0x80000000;
        auVar22._12_4_ = 0x80000000;
        uVar5 = vcmpss_avx512f(auVar22,ZEXT416((uint)fVar25),2);
        bVar6 = (bool)((byte)uVar5 & 1);
        auVar21._4_12_ = auVar22._4_12_;
        auVar21._0_4_ = (uint)bVar6 * (int)fVar25 + (uint)!bVar6 * (int)-fVar25;
        auVar23._0_4_ = -fVar16;
        auVar23._4_4_ = 0x80000000;
        auVar23._8_4_ = 0x80000000;
        auVar23._12_4_ = 0x80000000;
        uVar5 = vcmpss_avx512f(auVar23,ZEXT416((uint)fVar16),2);
        bVar6 = (bool)((byte)uVar5 & 1);
        auVar24._4_12_ = auVar23._4_12_;
        auVar24._0_4_ = (uint)bVar6 * (int)fVar16 + (uint)!bVar6 * (int)auVar23._0_4_;
        auVar22 = vmaxss_avx(auVar21,auVar24);
        auVar21 = vminss_avx(auVar24,auVar21);
        fVar25 = auVar22._0_4_;
      } while (auVar21._0_4_ /
               (float)((uint)(fVar25 < 1e-12) * 0x2b8cbccc + (uint)(fVar25 >= 1e-12) * (int)fVar25)
               <= 0.9);
      pfVar8 = dgTemplateVector<float>::operator[](&local_50,i_00);
      *pfVar8 = *pfVar8 + *pfVar8;
      InternalSphere::Statistics
                (this,(dgVector *)&local_40,(dgVector *)&local_50,vertex,triangles,indexCount,stride
                );
      iVar13 = iVar13 + 1;
      i_00 = -1;
LAB_008767c3:
    } while ((i_00 < 2) && (i_00 = i_00 + 1, iVar13 < 6));
  }
  else {
    fVar25 = (basis->m_front).super_dgTemplateVector<float>.m_y;
    fVar16 = (basis->m_front).super_dgTemplateVector<float>.m_z;
    fVar15 = (basis->m_front).super_dgTemplateVector<float>.m_w;
    (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_x =
         (basis->m_front).super_dgTemplateVector<float>.m_x;
    (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_y = fVar25;
    (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_z = fVar16;
    (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_w = fVar15;
    fVar25 = (basis->m_up).super_dgTemplateVector<float>.m_y;
    fVar16 = (basis->m_up).super_dgTemplateVector<float>.m_z;
    fVar15 = (basis->m_up).super_dgTemplateVector<float>.m_w;
    (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_x =
         (basis->m_up).super_dgTemplateVector<float>.m_x;
    (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_y = fVar25;
    (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_z = fVar16;
    (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_w = fVar15;
    fVar25 = (basis->m_right).super_dgTemplateVector<float>.m_y;
    fVar16 = (basis->m_right).super_dgTemplateVector<float>.m_z;
    fVar15 = (basis->m_right).super_dgTemplateVector<float>.m_w;
    (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_x =
         (basis->m_right).super_dgTemplateVector<float>.m_x;
    (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_y = fVar25;
    (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_z = fVar16;
    (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_w = fVar15;
    fVar25 = (basis->m_posit).super_dgTemplateVector<float>.m_y;
    fVar16 = (basis->m_posit).super_dgTemplateVector<float>.m_z;
    fVar15 = (basis->m_posit).super_dgTemplateVector<float>.m_w;
    (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_x =
         (basis->m_posit).super_dgTemplateVector<float>.m_x;
    (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_y = fVar25;
    (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_z = fVar16;
    (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_w = fVar15;
  }
  auVar27 = ZEXT464(0xd01502f9);
  auVar28 = ZEXT464(0x501502f9);
  uVar9 = 0;
  auVar22 = auVar28._0_16_;
  auVar24 = auVar27._0_16_;
  auVar21 = auVar22;
  auVar23 = auVar24;
  do {
    lVar10 = (long)triangles[uVar9] * (long)stride;
    auVar31 = ZEXT416((uint)vertex[lVar10]);
    HVar12 = (HaF32)ABS((float)vertex[lVar10 + 2]);
    auVar20 = vucomiss_avx512f(ZEXT416((uint)vertex[lVar10 + 2]));
    if (((((POPCOUNT((int)HVar12 + 0x80800000U & 0xff) & 1U) == 0) || (0x7f7fffff < (uint)HVar12))
        || (auVar19 = vucomiss_avx512f(ZEXT416((uint)vertex[lVar10 + 1])),
           0x7f7fffff >= (uint)HVar12)) ||
       ((0x7f7fffff < (uint)ABS((float)vertex[lVar10]) ||
        (0x7f7fffff < (uint)ABS((float)vertex[lVar10 + 1]))))) goto LAB_00876cd4;
    auVar17 = vmulss_avx512f(ZEXT416((uint)(this->super_dgMatrix).m_front.
                                           super_dgTemplateVector<float>.m_y),auVar19);
    auVar17 = vfmadd231ss_avx512f(auVar17,auVar31,
                                  ZEXT416((uint)(this->super_dgMatrix).m_front.
                                                super_dgTemplateVector<float>.m_x));
    auVar17 = vfmadd231ss_avx512f(auVar17,auVar20,
                                  ZEXT416((uint)(this->super_dgMatrix).m_front.
                                                super_dgTemplateVector<float>.m_z));
    auVar18 = vmulss_avx512f(ZEXT416((uint)(this->super_dgMatrix).m_up.super_dgTemplateVector<float>
                                           .m_y),auVar19);
    auVar18 = vfmadd231ss_avx512f(auVar18,auVar31,
                                  ZEXT416((uint)(this->super_dgMatrix).m_up.
                                                super_dgTemplateVector<float>.m_x));
    auVar18 = vfmadd231ss_avx512f(auVar18,auVar20,
                                  ZEXT416((uint)(this->super_dgMatrix).m_up.
                                                super_dgTemplateVector<float>.m_z));
    auVar19 = vmulss_avx512f(ZEXT416((uint)(this->super_dgMatrix).m_right.
                                           super_dgTemplateVector<float>.m_y),auVar19);
    auVar31 = vfmadd231ss_avx512f(auVar19,ZEXT416((uint)(this->super_dgMatrix).m_right.
                                                        super_dgTemplateVector<float>.m_x),auVar31);
    auVar20 = vfmadd231ss_avx512f(auVar31,ZEXT416((uint)(this->super_dgMatrix).m_right.
                                                        super_dgTemplateVector<float>.m_z),auVar20);
    uVar11 = auVar20._0_4_ & 0x7fffffff;
    auVar20 = vucomiss_avx512f(auVar20);
    if (((((POPCOUNT(uVar11 + 0x80800000 & 0xff) & 1U) == 0) ||
         ((0x7f7fffff < uVar11 || (auVar31 = vucomiss_avx512f(auVar18), 0x7f7fffff >= uVar11)))) ||
        (0x7f7fffff < (auVar17._0_4_ & 0x7fffffff))) || (0x7f7fffff < (auVar18._0_4_ & 0x7fffffff)))
    goto LAB_00876cd4;
    auVar18 = vminss_avx(auVar17,auVar28._0_16_);
    auVar28 = ZEXT1664(auVar18);
    auVar21 = vminss_avx512f(auVar31,auVar21);
    auVar22 = vminss_avx512f(auVar20,auVar22);
    auVar19 = vmaxss_avx(auVar17,auVar27._0_16_);
    auVar27 = ZEXT1664(auVar19);
    auVar23 = vmaxss_avx512f(auVar31,auVar23);
    auVar24 = vmaxss_avx512f(auVar20,auVar24);
    uVar9 = uVar9 + 1;
  } while ((uint)indexCount != uVar9);
  fVar25 = auVar18._0_4_;
  fVar15 = auVar21._0_4_;
  fVar16 = auVar22._0_4_;
  if ((((!NAN(fVar16)) && ((uint)ABS(fVar16) < 0x7f800000)) && (!NAN(fVar15))) &&
     (((uint)ABS(fVar15) < 0x7f800000 && ((uint)ABS(fVar25) < 0x7f800000)))) {
    fVar26 = auVar19._0_4_;
    fVar30 = auVar23._0_4_;
    fVar29 = auVar24._0_4_;
    if (((!NAN(fVar29)) && (((uint)ABS(fVar29) < 0x7f800000 && (!NAN(fVar30))))) &&
       (((uint)ABS(fVar30) < 0x7f800000 && ((uint)ABS(fVar26) < 0x7f800000)))) {
      if ((((uint)ABS(fVar26 + fVar25) < 0x7f800000) && ((uint)ABS(fVar30 + fVar15) < 0x7f800000))
         && ((uint)ABS(fVar29 + fVar16) < 0x7f800000)) {
        fVar2 = (fVar26 + fVar25) * 0.5;
        fVar3 = (fVar30 + fVar15) * 0.5;
        fVar4 = (fVar29 + fVar16) * 0.5;
        if ((((uint)ABS(fVar2) < 0x7f800000) && ((uint)ABS(fVar3) < 0x7f800000)) &&
           ((uint)ABS(fVar4) < 0x7f800000)) {
          auVar21 = ZEXT416((uint)fVar2);
          auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (this->super_dgMatrix).m_up.
                                                           super_dgTemplateVector<float>.m_x)),
                                    auVar21,ZEXT416((uint)(this->super_dgMatrix).m_front.
                                                          super_dgTemplateVector<float>.m_x));
          auVar24 = ZEXT416((uint)fVar4);
          auVar22 = vfmadd231ss_fma(auVar22,auVar24,
                                    ZEXT416((uint)(this->super_dgMatrix).m_right.
                                                  super_dgTemplateVector<float>.m_x));
          fVar2 = auVar22._0_4_ + (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_x;
          auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (this->super_dgMatrix).m_up.
                                                           super_dgTemplateVector<float>.m_y)),
                                    auVar21,ZEXT416((uint)(this->super_dgMatrix).m_front.
                                                          super_dgTemplateVector<float>.m_y));
          auVar22 = vfmadd231ss_fma(auVar22,auVar24,
                                    ZEXT416((uint)(this->super_dgMatrix).m_right.
                                                  super_dgTemplateVector<float>.m_y));
          fVar4 = auVar22._0_4_ + (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_y;
          auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (this->super_dgMatrix).m_up.
                                                           super_dgTemplateVector<float>.m_z)),
                                    auVar21,ZEXT416((uint)(this->super_dgMatrix).m_front.
                                                          super_dgTemplateVector<float>.m_z));
          auVar22 = vfmadd231ss_fma(auVar22,auVar24,
                                    ZEXT416((uint)(this->super_dgMatrix).m_right.
                                                  super_dgTemplateVector<float>.m_z));
          fVar3 = auVar22._0_4_ + (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_z;
          if (((NAN(fVar3)) || (NAN(fVar4))) ||
             ((0x7f7fffff < (uint)ABS(fVar2) ||
              ((0x7f7fffff < (uint)ABS(fVar4) || (0x7f7fffff < (uint)ABS(fVar3)))))))
          goto LAB_00876cd4;
          auVar22 = vinsertps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar4),0x10);
          dVar1 = (dgTemplateVector<float>)vinsertps_avx(auVar22,ZEXT416((uint)fVar3),0x28);
          (this->super_dgMatrix).m_posit.super_dgTemplateVector<float> = dVar1;
          if (((uint)ABS(fVar26 - fVar25) < 0x7f800000) &&
             (((uint)ABS(fVar30 - fVar15) < 0x7f800000 && ((uint)ABS(fVar29 - fVar16) < 0x7f800000))
             )) {
            fVar25 = (fVar26 - fVar25) * 0.5;
            fVar15 = (fVar30 - fVar15) * 0.5;
            fVar16 = (fVar29 - fVar16) * 0.5;
            if (((uint)ABS(fVar25) < 0x7f800000) &&
               (((uint)ABS(fVar15) < 0x7f800000 && ((uint)ABS(fVar16) < 0x7f800000)))) {
              auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * fVar15)),ZEXT416((uint)fVar25),
                                        ZEXT416((uint)fVar25));
              auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)fVar16),ZEXT416((uint)fVar16));
              if (auVar22._0_4_ < 0.0) {
                fVar26 = sqrtf(auVar22._0_4_);
              }
              else {
                auVar22 = vsqrtss_avx(auVar22,auVar22);
                fVar26 = auVar22._0_4_;
              }
              if (!NAN(fVar26)) {
                auVar20._0_8_ = (ulong)(uint)fVar15 ^ 0x8000000080000000;
                auVar20._8_4_ = 0x80000000;
                auVar20._12_4_ = 0x80000000;
                auVar31._0_8_ = (ulong)(uint)fVar16 ^ 0x8000000080000000;
                auVar31._8_4_ = 0x80000000;
                auVar31._12_4_ = 0x80000000;
                uVar5 = vcmpss_avx512f(auVar20,ZEXT416((uint)fVar15),2);
                bVar6 = (bool)((byte)uVar5 & 1);
                uVar5 = vcmpss_avx512f(auVar31,ZEXT416((uint)fVar16),2);
                bVar7 = (bool)((byte)uVar5 & 1);
                fVar15 = (float)((uint)bVar6 * (int)fVar15 + (uint)!bVar6 * (int)-fVar15);
                fVar16 = (float)((uint)bVar7 * (int)fVar16 + (uint)!bVar7 * (int)-fVar16);
                if ((!NAN(fVar16) && !NAN(fVar15)) && ((uint)ABS(fVar26) < 0x7f800000)) {
                  auVar19._8_4_ = 0x80000000;
                  auVar19._0_8_ = 0x8000000080000000;
                  auVar19._12_4_ = 0x80000000;
                  auVar22 = vxorps_avx512vl(ZEXT416((uint)fVar25),auVar19);
                  uVar5 = vcmpss_avx512f(auVar22,ZEXT416((uint)fVar25),2);
                  bVar6 = (bool)((byte)uVar5 & 1);
                  (this->m_size).super_dgTemplateVector<float>.m_x =
                       (float)((uint)bVar6 * (int)fVar25 + (uint)!bVar6 * auVar22._0_4_);
                  (this->m_size).super_dgTemplateVector<float>.m_y = fVar15;
                  (this->m_size).super_dgTemplateVector<float>.m_z = fVar16;
                  (this->m_size).super_dgTemplateVector<float>.m_w = fVar26;
                  return;
                }
              }
              goto LAB_00876cd4;
            }
          }
        }
      }
      __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                    ,0x121,"dgVector::dgVector(const dgTemplateVector<hacd::HaF32> &)");
    }
  }
LAB_00876cd4:
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x134,"dgVector::dgVector(hacd::HaF32, hacd::HaF32, hacd::HaF32, hacd::HaF32)");
}

Assistant:

void dgSphere::SetDimensions (const hacd::HaF32 vertex[], hacd::HaI32 strideInBytes, const hacd::HaI32 triangles[], hacd::HaI32 indexCount, const dgMatrix *basis)
{
	dgVector eigen;
	dgVector scaleVector (hacd::HaF32 (1.0f), hacd::HaF32 (1.0f), hacd::HaF32 (1.0f), hacd::HaF32 (0.0f));

	if (indexCount < 3) {
		return;
	}

	hacd::HaI32 stride = hacd::HaI32 (strideInBytes / sizeof (hacd::HaF32));
	if (!basis)	{

		InternalSphere::Statistics (*this, eigen, scaleVector, vertex, triangles, indexCount, stride);

		hacd::HaI32 k = 0;
		for (hacd::HaI32 i = 0; i < 3; i ++) {
			if (k >= 6) {
				 break;
			}
			for (hacd::HaI32 j = i + 1; j < 3; j ++) {
				hacd::HaF32 aspect = InternalSphere::AspectRatio (eigen[i], eigen[j]);
				if (aspect > hacd::HaF32 (0.9f)) {
					scaleVector[i] *= hacd::HaF32 (2.0f); 
					InternalSphere::Statistics (*this, eigen, scaleVector, vertex, triangles, indexCount, stride);
					k ++;
					i = -1;
					break;
				}
			}
		}
	} else {
		*this = *basis;
	}

	dgVector min; 
	dgVector max;
	InternalSphere::BoundingBox (*this, vertex, stride, triangles, indexCount, min, max);

	dgVector massCenter	(max + min);
	massCenter = massCenter.Scale (hacd::HaF32 (0.5f));
	m_posit = TransformVector (massCenter);

	dgVector dim (max - min);
	dim = dim.Scale (hacd::HaF32(0.5f));
	SetDimensions (dim.m_x, dim.m_y, dim.m_z);
}